

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

void Fra_ImpAddToSolver(Fra_Man_t *p,Vec_Int_t *vImps,int *pSatVarNums)

{
  sat_solver *s;
  ulong uVar1;
  Vec_Int_t *vImps_00;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int pLits [2];
  uint local_48;
  int local_44;
  Vec_Int_t *local_40;
  ulong local_38;
  
  s = p->pSat;
  uVar6 = 0;
  local_40 = vImps;
  do {
    vImps_00 = local_40;
    if (local_40->nSize <= (int)uVar6) {
      iVar3 = sat_solver_simplify(s);
      if (iVar3 == 0) {
        sat_solver_delete(s);
        p->pSat = (sat_solver *)0x0;
      }
      Fra_ImpCompactArray(vImps_00);
      return;
    }
    local_38 = uVar6;
    uVar2 = Vec_IntEntry(local_40,(int)uVar6);
    pAVar4 = Aig_ManObj(p->pManAig,uVar2 & 0xffff);
    pAVar5 = Aig_ManObj(p->pManAig,(int)uVar2 >> 0x10);
    iVar3 = p->pPars->nFramesK;
    iVar7 = 0;
    if (iVar3 < 1) {
      iVar3 = iVar7;
    }
    for (; iVar3 != iVar7; iVar7 = iVar7 + 1) {
      if (((*(byte *)((*(ulong *)(*(long *)((long)(pAVar4->field_5).pData + 0x20) +
                                 (long)(pAVar4->Id * *(int *)((long)(pAVar4->field_5).pData + 0x18)
                                       + iVar7) * 8) & 0xfffffffffffffffe) + 0x18) & 7) == 0) ||
         ((*(byte *)((*(ulong *)(*(long *)((long)(pAVar5->field_5).pData + 0x20) +
                                (long)(*(int *)((long)(pAVar5->field_5).pData + 0x18) * pAVar5->Id +
                                      iVar7) * 8) & 0xfffffffffffffffe) + 0x18) & 7) == 0)) {
        Vec_IntWriteEntry(local_40,(int)local_38,0);
        if (iVar7 < p->pPars->nFramesK) goto LAB_004d61be;
        break;
      }
    }
    lVar8 = 0;
    while ((int)lVar8 < p->pPars->nFramesK) {
      uVar6 = *(ulong *)(*(long *)((long)(pAVar4->field_5).pData + 0x20) +
                        ((long)pAVar4->Id * (long)*(int *)((long)(pAVar4->field_5).pData + 0x18) +
                        lVar8) * 8);
      iVar3 = pSatVarNums[*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24)];
      if ((iVar3 < 1) || (p->nSatVars <= iVar3)) {
        __assert_fail("Left > 0 && Left < p->nSatVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraImp.c"
                      ,0x1cf,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
      }
      uVar1 = *(ulong *)(*(long *)((long)(pAVar5->field_5).pData + 0x20) +
                        ((long)pAVar5->Id * (long)*(int *)((long)(pAVar5->field_5).pData + 0x18) +
                        lVar8) * 8);
      iVar7 = pSatVarNums[*(int *)((uVar1 & 0xfffffffffffffffe) + 0x24)];
      if ((iVar7 < 1) || (p->nSatVars <= iVar7)) {
        __assert_fail("Right > 0 && Right < p->nSatVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraImp.c"
                      ,0x1d0,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
      }
      local_48 = (((uint)uVar6 ^ *(uint *)&pAVar4->field_0x18 >> 3) & 1) + iVar3 * 2 ^ 1;
      local_44 = (((uint)uVar1 ^ *(uint *)&pAVar5->field_0x18 >> 3) & 1) + iVar7 * 2;
      iVar3 = sat_solver_addclause(s,(lit *)&local_48,(lit *)&local_40);
      lVar8 = lVar8 + 1;
      if (iVar3 == 0) {
        sat_solver_delete(s);
        p->pSat = (sat_solver *)0x0;
        return;
      }
    }
LAB_004d61be:
    uVar6 = (ulong)((int)local_38 + 1);
  } while( true );
}

Assistant:

void Fra_ImpAddToSolver( Fra_Man_t * p, Vec_Int_t * vImps, int * pSatVarNums )
{
    sat_solver * pSat = p->pSat;
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int pLits[2], Imp, Left, Right, i, f, status;
    int fComplL, fComplR;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if all the nodes are present
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            if ( Aig_ObjIsNone(Aig_Regular(pLeftF)) || Aig_ObjIsNone(Aig_Regular(pRightF)) )
            {
                Vec_IntWriteEntry( vImps, i, 0 );
                break;
            }
        } 
        if ( f < p->pPars->nFramesK )
            continue;
        // add constraints in each timeframe
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            // get the corresponding SAT numbers
            Left = pSatVarNums[ Aig_Regular(pLeftF)->Id ];
            Right = pSatVarNums[ Aig_Regular(pRightF)->Id ];
            assert( Left > 0  && Left < p->nSatVars );
            assert( Right > 0 && Right < p->nSatVars );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
            // get the constraint
            // L => R      L' v R     (complement = L & R')
            pLits[0] = 2 * Left  + !fComplL;
            pLits[1] = 2 * Right +  fComplR;
            // add constraint to solver
            if ( !sat_solver_addclause( pSat, pLits, pLits + 2 ) )
            {
                sat_solver_delete( pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        p->pSat = NULL;
    }
//    printf( "Total imps = %d. ", Vec_IntSize(vImps) );
    Fra_ImpCompactArray( vImps );
//    printf( "Valid imps = %d. \n", Vec_IntSize(vImps) );
}